

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_write_container(cram_fd *fd,cram_container *c)

{
  ushort uVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  byte bVar8;
  uint *buffer;
  size_t sVar7;
  byte bVar9;
  byte bVar10;
  long lVar11;
  byte *pbVar12;
  long lVar13;
  ulong uStack_430;
  char buf_a [1024];
  
  buffer = (uint *)buf_a;
  if (0xc1 < c->num_landmarks) {
    buffer = (uint *)malloc((ulong)(uint)c->num_landmarks * 5 + 0x37);
  }
  uVar5 = c->length;
  uStack_430 = 4;
  if ((fd->version & 0xffffff00U) == 0x100) {
    bVar3 = (byte)uVar5;
    if (uVar5 < 0x80) {
      *(byte *)buffer = bVar3;
      uStack_430 = 1;
    }
    else {
      bVar8 = (byte)(uVar5 >> 8);
      if (uVar5 < 0x4000) {
        *(byte *)buffer = bVar8 | 0x80;
        *(byte *)((long)buffer + 1) = bVar3;
        uStack_430 = 2;
      }
      else {
        bVar9 = (byte)(uVar5 >> 0x10);
        if (uVar5 < 0x200000) {
          *(byte *)buffer = bVar9 | 0xc0;
          *(byte *)((long)buffer + 1) = bVar8;
          *(byte *)((long)buffer + 2) = bVar3;
          uStack_430 = 3;
        }
        else {
          bVar10 = (byte)(uVar5 >> 0x18);
          if (uVar5 < 0x10000000) {
            *(byte *)buffer = bVar10 | 0xe0;
            *(byte *)((long)buffer + 1) = bVar9;
            *(byte *)((long)buffer + 2) = bVar8;
            *(byte *)((long)buffer + 3) = bVar3;
          }
          else {
            *(byte *)buffer = bVar10 >> 4 | 0xf0;
            *(char *)((long)buffer + 1) = (char)(uVar5 >> 0x14);
            *(char *)((long)buffer + 2) = (char)(uVar5 >> 0xc);
            *(char *)((long)buffer + 3) = (char)(uVar5 >> 4);
            *(byte *)(buffer + 1) = bVar3 & 0xf;
            uStack_430 = 5;
          }
        }
      }
    }
  }
  else {
    *buffer = uVar5;
  }
  pbVar12 = (byte *)(uStack_430 + (long)buffer);
  if (c->multi_seq == 0) {
    uVar5 = c->ref_seq_id;
    if (uVar5 < 0x80) {
      *pbVar12 = (byte)uVar5;
      uStack_430 = 1;
    }
    else {
      bVar3 = (byte)(uVar5 >> 8);
      if (uVar5 < 0x4000) {
        *pbVar12 = bVar3 | 0x80;
        pbVar12[1] = (byte)uVar5;
        uStack_430 = 2;
      }
      else {
        bVar8 = (byte)(uVar5 >> 0x10);
        if (uVar5 < 0x200000) {
          *pbVar12 = bVar8 | 0xc0;
          pbVar12[1] = bVar3;
          pbVar12[2] = (byte)c->ref_seq_id;
          uStack_430 = 3;
        }
        else {
          bVar3 = (byte)(uVar5 >> 0x18);
          if (uVar5 < 0x10000000) {
            *pbVar12 = bVar3 | 0xe0;
            pbVar12[1] = bVar8;
            uVar1 = (ushort)c->ref_seq_id;
            *(ushort *)(pbVar12 + 2) = uVar1 << 8 | uVar1 >> 8;
            uStack_430 = 4;
          }
          else {
            *pbVar12 = bVar3 >> 4 | 0xf0;
            pbVar12[1] = (byte)(uVar5 >> 0x14);
            uVar5 = c->ref_seq_id;
            pbVar12[2] = (byte)(uVar5 >> 0xc);
            pbVar12[3] = (byte)(uVar5 >> 4);
            pbVar12[4] = (byte)c->ref_seq_id & 0xf;
            uStack_430 = 5;
          }
        }
      }
    }
    pbVar12 = pbVar12 + uStack_430;
    uVar5 = c->ref_seq_start;
    if (uVar5 < 0x80) {
      *pbVar12 = (byte)uVar5;
      uStack_430 = 1;
    }
    else if (uVar5 < 0x4000) {
      *pbVar12 = (byte)(uVar5 >> 8) | 0x80;
      pbVar12[1] = (byte)c->ref_seq_start;
      uStack_430 = 2;
    }
    else if (uVar5 < 0x200000) {
      *pbVar12 = (byte)(uVar5 >> 0x10) | 0xc0;
      uVar1 = (ushort)c->ref_seq_start;
      *(ushort *)(pbVar12 + 1) = uVar1 << 8 | uVar1 >> 8;
      uStack_430 = 3;
    }
    else {
      bVar3 = (byte)(uVar5 >> 0x18);
      if (uVar5 < 0x10000000) {
        *pbVar12 = bVar3 | 0xe0;
        uVar1 = *(ushort *)((long)&c->ref_seq_start + 1);
        *(ushort *)(pbVar12 + 1) = uVar1 << 8 | uVar1 >> 8;
        pbVar12[3] = (byte)c->ref_seq_start;
        uStack_430 = 4;
      }
      else {
        *pbVar12 = bVar3 >> 4 | 0xf0;
        uVar5 = c->ref_seq_start;
        pbVar12[1] = (byte)(uVar5 >> 0x14);
        pbVar12[2] = (byte)(uVar5 >> 0xc);
        uVar5 = c->ref_seq_start;
        pbVar12[3] = (byte)(uVar5 >> 4);
        pbVar12[4] = (byte)uVar5 & 0xf;
        uStack_430 = 5;
      }
    }
    pbVar12 = pbVar12 + uStack_430;
    uVar5 = c->ref_seq_span;
    if (uVar5 < 0x80) {
      *pbVar12 = (byte)uVar5;
      uStack_430 = 1;
    }
    else if (uVar5 < 0x4000) {
      *pbVar12 = (byte)(uVar5 >> 8) | 0x80;
      pbVar12[1] = (byte)c->ref_seq_span;
      uStack_430 = 2;
    }
    else if (uVar5 < 0x200000) {
      *pbVar12 = (byte)(uVar5 >> 0x10) | 0xc0;
      uVar1 = (ushort)c->ref_seq_span;
      *(ushort *)(pbVar12 + 1) = uVar1 << 8 | uVar1 >> 8;
      uStack_430 = 3;
    }
    else {
      bVar3 = (byte)(uVar5 >> 0x18);
      if (uVar5 < 0x10000000) {
        *pbVar12 = bVar3 | 0xe0;
        uVar1 = *(ushort *)((long)&c->ref_seq_span + 1);
        *(ushort *)(pbVar12 + 1) = uVar1 << 8 | uVar1 >> 8;
        pbVar12[3] = (byte)c->ref_seq_span;
        uStack_430 = 4;
      }
      else {
        *pbVar12 = bVar3 >> 4 | 0xf0;
        uVar5 = c->ref_seq_span;
        pbVar12[1] = (byte)(uVar5 >> 0x14);
        pbVar12[2] = (byte)(uVar5 >> 0xc);
        uVar5 = c->ref_seq_span;
        pbVar12[3] = (byte)(uVar5 >> 4);
        pbVar12[4] = (byte)uVar5 & 0xf;
        uStack_430 = 5;
      }
    }
    pbVar12 = pbVar12 + uStack_430;
  }
  else {
    pbVar12[0] = 0xff;
    pbVar12[1] = 0xff;
    pbVar12[2] = 0xff;
    pbVar12[3] = 0xff;
    pbVar12[4] = 0xe;
    pbVar12[5] = 0;
    pbVar12[6] = 0;
    pbVar12 = pbVar12 + 7;
  }
  uVar5 = c->num_records;
  if (uVar5 < 0x80) {
    *pbVar12 = (byte)uVar5;
    uStack_430 = 1;
  }
  else if (uVar5 < 0x4000) {
    uStack_430 = 2;
    *pbVar12 = (byte)(uVar5 >> 8) | 0x80;
    pbVar12[1] = (byte)c->num_records;
  }
  else if (uVar5 < 0x200000) {
    uStack_430 = 3;
    *pbVar12 = (byte)(uVar5 >> 0x10) | 0xc0;
    pbVar12[1] = *(byte *)((long)&c->num_records + 1);
    pbVar12[2] = (byte)c->num_records;
  }
  else {
    bVar3 = (byte)(uVar5 >> 0x18);
    if (uVar5 < 0x10000000) {
      *pbVar12 = bVar3 | 0xe0;
      pbVar12[1] = *(byte *)((long)&c->num_records + 2);
      pbVar12[2] = *(byte *)((long)&c->num_records + 1);
      pbVar12[3] = (byte)c->num_records;
      uStack_430 = 4;
    }
    else {
      uStack_430 = 5;
      *pbVar12 = bVar3 >> 4 | 0xf0;
      pbVar12[1] = (byte)((uint)c->num_records >> 0x14);
      pbVar12[2] = (byte)((uint)c->num_records >> 0xc);
      pbVar12[3] = (byte)((uint)c->num_records >> 4);
      pbVar12[4] = (byte)c->num_records & 0xf;
    }
  }
  pbVar12 = pbVar12 + uStack_430;
  iVar4 = fd->version >> 8;
  if (iVar4 == 2) {
    uVar2 = c->record_counter;
    if (uVar2 < 0x80) {
      *pbVar12 = (byte)uVar2;
      uStack_430 = 1;
    }
    else if (uVar2 < 0x4000) {
      *pbVar12 = (byte)(uVar2 >> 8) | 0x80;
      pbVar12[1] = (byte)c->record_counter;
      uStack_430 = 2;
    }
    else if (uVar2 < 0x200000) {
      *pbVar12 = (byte)(uVar2 >> 0x10) | 0xc0;
      pbVar12[1] = *(byte *)((long)&c->record_counter + 1);
      pbVar12[2] = (byte)c->record_counter;
      uStack_430 = 3;
    }
    else {
      bVar3 = (byte)(uVar2 >> 0x18);
      if (uVar2 < 0x10000000) {
        *pbVar12 = bVar3 | 0xe0;
        pbVar12[1] = *(byte *)((long)&c->record_counter + 2);
        pbVar12[2] = *(byte *)((long)&c->record_counter + 1);
        pbVar12[3] = (byte)c->record_counter;
        uStack_430 = 4;
      }
      else {
        *pbVar12 = bVar3 >> 4 | 0xf0;
        pbVar12[1] = (byte)((uint)c->record_counter >> 0x14);
        pbVar12[2] = (byte)((uint)c->record_counter >> 0xc);
        pbVar12[3] = (byte)((uint)c->record_counter >> 4);
        pbVar12[4] = (byte)c->record_counter & 0xf;
        uStack_430 = 5;
      }
    }
  }
  else {
    if (iVar4 < 3) goto LAB_00122294;
    uVar5 = ltf8_put((char *)pbVar12,c->record_counter);
    uStack_430 = (ulong)uVar5;
  }
  uVar5 = ltf8_put((char *)(pbVar12 + uStack_430),c->num_bases);
  pbVar12 = pbVar12 + uStack_430 + uVar5;
LAB_00122294:
  uVar5 = c->num_blocks;
  if (uVar5 < 0x80) {
    *pbVar12 = (byte)uVar5;
    uStack_430 = 1;
  }
  else if (uVar5 < 0x4000) {
    *pbVar12 = (byte)(uVar5 >> 8) | 0x80;
    pbVar12[1] = (byte)c->num_blocks;
    uStack_430 = 2;
  }
  else if (uVar5 < 0x200000) {
    *pbVar12 = (byte)(uVar5 >> 0x10) | 0xc0;
    pbVar12[1] = *(byte *)((long)&c->num_blocks + 1);
    pbVar12[2] = (byte)c->num_blocks;
    uStack_430 = 3;
  }
  else {
    bVar3 = (byte)(uVar5 >> 0x18);
    if (uVar5 < 0x10000000) {
      *pbVar12 = bVar3 | 0xe0;
      pbVar12[1] = *(byte *)((long)&c->num_blocks + 2);
      pbVar12[2] = *(byte *)((long)&c->num_blocks + 1);
      pbVar12[3] = (byte)c->num_blocks;
      uStack_430 = 4;
    }
    else {
      *pbVar12 = bVar3 >> 4 | 0xf0;
      pbVar12[1] = (byte)((uint)c->num_blocks >> 0x14);
      pbVar12[2] = (byte)((uint)c->num_blocks >> 0xc);
      pbVar12[3] = (byte)((uint)c->num_blocks >> 4);
      pbVar12[4] = (byte)c->num_blocks & 0xf;
      uStack_430 = 5;
    }
  }
  pbVar12 = pbVar12 + uStack_430;
  uVar5 = c->num_landmarks;
  if (uVar5 < 0x80) {
    *pbVar12 = (byte)uVar5;
    uStack_430 = 1;
  }
  else if (uVar5 < 0x4000) {
    *pbVar12 = (byte)(uVar5 >> 8) | 0x80;
    pbVar12[1] = (byte)c->num_landmarks;
    uStack_430 = 2;
  }
  else if (uVar5 < 0x200000) {
    *pbVar12 = (byte)(uVar5 >> 0x10) | 0xc0;
    pbVar12[1] = *(byte *)((long)&c->num_landmarks + 1);
    pbVar12[2] = (byte)c->num_landmarks;
    uStack_430 = 3;
  }
  else {
    bVar3 = (byte)(uVar5 >> 0x18);
    if (uVar5 < 0x10000000) {
      *pbVar12 = bVar3 | 0xe0;
      pbVar12[1] = *(byte *)((long)&c->num_landmarks + 2);
      pbVar12[2] = *(byte *)((long)&c->num_landmarks + 1);
      pbVar12[3] = (byte)c->num_landmarks;
      uStack_430 = 4;
    }
    else {
      *pbVar12 = bVar3 >> 4 | 0xf0;
      pbVar12[1] = (byte)((uint)c->num_landmarks >> 0x14);
      pbVar12[2] = (byte)((uint)c->num_landmarks >> 0xc);
      pbVar12[3] = (byte)((uint)c->num_landmarks >> 4);
      pbVar12[4] = (byte)c->num_landmarks & 0xf;
      uStack_430 = 5;
    }
  }
  pbVar12 = pbVar12 + uStack_430;
  for (lVar11 = 0; lVar11 < c->num_landmarks; lVar11 = lVar11 + 1) {
    uVar5 = c->landmark[lVar11];
    if (uVar5 < 0x80) {
      *pbVar12 = (byte)uVar5;
      lVar13 = 1;
    }
    else if (uVar5 < 0x4000) {
      *pbVar12 = (byte)(uVar5 >> 8) | 0x80;
      pbVar12[1] = *(byte *)(c->landmark + lVar11);
      lVar13 = 2;
    }
    else if (uVar5 < 0x200000) {
      *pbVar12 = (byte)(uVar5 >> 0x10) | 0xc0;
      pbVar12[1] = *(byte *)((long)c->landmark + lVar11 * 4 + 1);
      pbVar12[2] = *(byte *)(c->landmark + lVar11);
      lVar13 = 3;
    }
    else {
      bVar3 = (byte)(uVar5 >> 0x18);
      if (uVar5 < 0x10000000) {
        *pbVar12 = bVar3 | 0xe0;
        pbVar12[1] = *(byte *)((long)c->landmark + lVar11 * 4 + 2);
        pbVar12[2] = *(byte *)((long)c->landmark + lVar11 * 4 + 1);
        pbVar12[3] = *(byte *)(c->landmark + lVar11);
        lVar13 = 4;
      }
      else {
        *pbVar12 = bVar3 >> 4 | 0xf0;
        pbVar12[1] = (byte)((uint)c->landmark[lVar11] >> 0x14);
        pbVar12[2] = (byte)((uint)c->landmark[lVar11] >> 0xc);
        pbVar12[3] = (byte)((uint)c->landmark[lVar11] >> 4);
        pbVar12[4] = *(byte *)(c->landmark + lVar11) & 0xf;
        lVar13 = 5;
      }
    }
    pbVar12 = pbVar12 + lVar13;
  }
  if (0x2ff < fd->version) {
    uVar6 = crc32(0,buffer,(int)pbVar12 - (int)buffer);
    c->crc32 = uVar6;
    *pbVar12 = (byte)uVar6;
    pbVar12[1] = *(byte *)((long)&c->crc32 + 1);
    pbVar12[2] = *(byte *)((long)&c->crc32 + 2);
    pbVar12[3] = *(byte *)((long)&c->crc32 + 3);
    pbVar12 = pbVar12 + 4;
  }
  sVar7 = hwrite(fd->fp,buffer,(long)pbVar12 - (long)buffer);
  if (buffer != (uint *)buf_a) {
    free(buffer);
  }
  return -(uint)((long)pbVar12 - (long)buffer != sVar7);
}

Assistant:

int cram_write_container(cram_fd *fd, cram_container *c) {
    char buf_a[1024], *buf = buf_a, *cp;
    int i;

    if (55 + c->num_landmarks * 5 >= 1024)
	buf = malloc(55 + c->num_landmarks * 5);
    cp = buf;

    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	cp += itf8_put(cp, c->length);
    } else {
	*(int32_t *)cp = le_int4(c->length);
	cp += 4;
    }
    if (c->multi_seq) {
	cp += itf8_put(cp, -2);
	cp += itf8_put(cp, 0);
	cp += itf8_put(cp, 0);
    } else {
	cp += itf8_put(cp, c->ref_seq_id);
	cp += itf8_put(cp, c->ref_seq_start);
	cp += itf8_put(cp, c->ref_seq_span);
    }
    cp += itf8_put(cp, c->num_records);
    if (CRAM_MAJOR_VERS(fd->version) == 2) {
	cp += itf8_put(cp, c->record_counter);
	cp += ltf8_put(cp, c->num_bases);
    } else if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	cp += ltf8_put(cp, c->record_counter);
	cp += ltf8_put(cp, c->num_bases);
    }

    cp += itf8_put(cp, c->num_blocks);
    cp += itf8_put(cp, c->num_landmarks);
    for (i = 0; i < c->num_landmarks; i++)
	cp += itf8_put(cp, c->landmark[i]);

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	c->crc32 = crc32(0L, (uc *)buf, cp-buf);
	cp[0] =  c->crc32        & 0xff;
	cp[1] = (c->crc32 >>  8) & 0xff;
	cp[2] = (c->crc32 >> 16) & 0xff;
	cp[3] = (c->crc32 >> 24) & 0xff;
	cp += 4;
    }

    if (cp-buf != hwrite(fd->fp, buf, cp-buf)) {
	if (buf != buf_a)
	    free(buf);
	return -1;
    }

    if (buf != buf_a)
	free(buf);

    return 0;
}